

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  ImGuiViewport *pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImRect IVar9;
  
  pIVar3 = GImGui;
  pIVar4 = GetMainViewport();
  IVar1 = pIVar4->Pos;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = IVar1.x;
  auVar5._4_4_ = IVar1.y;
  auVar6._0_4_ = IVar1.x + (pIVar4->Size).x;
  auVar6._4_4_ = IVar1.y + (pIVar4->Size).y;
  auVar6._8_8_ = 0;
  IVar1 = (pIVar3->Style).DisplaySafeAreaPadding;
  auVar2 = vsubps_avx(auVar6,auVar5);
  auVar8._0_4_ = IVar1.x + IVar1.x;
  auVar8._4_4_ = IVar1.y + IVar1.y;
  auVar8._8_8_ = 0;
  auVar2 = vcmpps_avx(auVar8,auVar2,1);
  auVar7._0_8_ = (ulong)IVar1 ^ 0x8000000080000000;
  auVar7._8_4_ = 0x80000000;
  auVar7._12_4_ = 0x80000000;
  auVar2 = vandps_avx(auVar2,auVar7);
  auVar5 = vsubps_avx(auVar5,auVar2);
  IVar9.Max.x = auVar6._0_4_ + auVar2._0_4_;
  IVar9.Max.y = auVar6._4_4_ + auVar2._4_4_;
  IVar9.Min = auVar5._0_8_;
  return IVar9;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}